

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

void af_glyph_hints_align_strong_points(AF_GlyphHints hints,AF_Dimension dim)

{
  short sVar1;
  int iVar2;
  AF_Edge_conflict pAVar3;
  ushort uVar4;
  FT_UShort *pFVar5;
  FT_Int32 FVar6;
  AF_Edge_conflict pAVar7;
  long lVar8;
  long lVar9;
  FT_Long FVar10;
  AF_Edge_conflict after;
  AF_Edge_conflict before;
  FT_PtrDist nn;
  FT_Pos fpos;
  FT_PtrDist mid;
  FT_PtrDist max;
  FT_PtrDist min;
  FT_Pos delta;
  FT_Pos fu;
  FT_Pos ou;
  FT_Pos u;
  AF_Edge_conflict edge;
  AF_Point_conflict point;
  FT_UInt touch_flag;
  AF_Edge_conflict edge_limit;
  AF_Edge_conflict edges;
  AF_AxisHints axis;
  AF_Point_conflict point_limit;
  AF_Point_conflict points;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  edge = (AF_Edge_conflict)hints->points;
  iVar2 = hints->num_points;
  pFVar5 = (FT_UShort *)&edge->fpos;
  pAVar3 = hints->axis[dim].edges;
  pAVar7 = pAVar3 + hints->axis[dim].num_edges;
  if (dim == AF_DIMENSION_HORZ) {
    uVar4 = 4;
  }
  else {
    uVar4 = 8;
  }
  if (pAVar3 < pAVar7) {
    for (; edge < (AF_Edge_conflict)(pFVar5 + (long)iVar2 * 0x28);
        edge = (AF_Edge_conflict)&edge->last) {
      if (((edge->fpos & uVar4) == 0) && ((edge->fpos & 0x10U) == 0)) {
        if (dim == AF_DIMENSION_VERT) {
          sVar1 = *(short *)&edge->field_0x1a;
          fu = edge->pos;
        }
        else {
          sVar1._0_1_ = edge->flags;
          sVar1._1_1_ = edge->dir;
          fu = edge->opos;
        }
        ou = (FT_Pos)sVar1;
        if (pAVar3->fpos - ou < 0) {
          if (ou - pAVar7[-1].fpos < 0) {
            max = 0;
            lVar8 = ((long)pAVar7 - (long)pAVar3) / 0x58;
            if (lVar8 < 9) {
              before = (AF_Edge_conflict)0x0;
              while (((long)before < lVar8 && (pAVar3[(long)before].fpos < ou))) {
                before = (AF_Edge_conflict)((long)&before->fpos + 1);
              }
              if (pAVar3[(long)before].fpos == ou) {
                ou = pAVar3[(long)before].pos;
                goto LAB_001c8aff;
              }
              max = (FT_PtrDist)before;
            }
            else {
              while (mid = lVar8, max < mid) {
                lVar8 = mid + max >> 1;
                lVar9 = (long)pAVar3[lVar8].fpos;
                if (lVar9 <= ou) {
                  if (ou <= lVar9) {
                    ou = pAVar3[lVar8].pos;
                    goto LAB_001c8aff;
                  }
                  max = lVar8 + 1;
                  lVar8 = mid;
                }
              }
            }
            if (pAVar3[max + -1].scale == 0) {
              FVar10 = FT_DivFix(pAVar3[max].pos - pAVar3[max + -1].pos,
                                 (long)((int)pAVar3[max].fpos - (int)pAVar3[max + -1].fpos));
              pAVar3[max + -1].scale = FVar10;
            }
            lVar8 = pAVar3[max + -1].pos;
            FVar6 = FT_MulFix_x86_64((int)sVar1 - (int)pAVar3[max + -1].fpos,
                                     (FT_Int32)pAVar3[max + -1].scale);
            ou = lVar8 + FVar6;
          }
          else {
            ou = pAVar7[-1].pos + (fu - pAVar7[-1].opos);
          }
        }
        else {
          ou = pAVar3->pos - (pAVar3->opos - fu);
        }
LAB_001c8aff:
        if (dim == AF_DIMENSION_HORZ) {
          edge->scale = ou;
        }
        else {
          edge->blue_edge = (AF_Width)ou;
        }
        edge->fpos = edge->fpos | uVar4;
      }
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_strong_points( AF_GlyphHints  hints,
                                      AF_Dimension   dim )
  {
    AF_Point      points      = hints->points;
    AF_Point      point_limit = points + hints->num_points;
    AF_AxisHints  axis        = &hints->axis[dim];
    AF_Edge       edges       = axis->edges;
    AF_Edge       edge_limit  = edges + axis->num_edges;
    FT_UInt       touch_flag;


    if ( dim == AF_DIMENSION_HORZ )
      touch_flag = AF_FLAG_TOUCH_X;
    else
      touch_flag  = AF_FLAG_TOUCH_Y;

    if ( edges < edge_limit )
    {
      AF_Point  point;
      AF_Edge   edge;


      for ( point = points; point < point_limit; point++ )
      {
        FT_Pos  u, ou, fu;  /* point position */
        FT_Pos  delta;


        if ( point->flags & touch_flag )
          continue;

        /* if this point is candidate to weak interpolation, we       */
        /* interpolate it after all strong points have been processed */

        if ( ( point->flags & AF_FLAG_WEAK_INTERPOLATION ) )
          continue;

        if ( dim == AF_DIMENSION_VERT )
        {
          u  = point->fy;
          ou = point->oy;
        }
        else
        {
          u  = point->fx;
          ou = point->ox;
        }

        fu = u;

        /* is the point before the first edge? */
        edge  = edges;
        delta = edge->fpos - u;
        if ( delta >= 0 )
        {
          u = edge->pos - ( edge->opos - ou );
          goto Store_Point;
        }

        /* is the point after the last edge? */
        edge  = edge_limit - 1;
        delta = u - edge->fpos;
        if ( delta >= 0 )
        {
          u = edge->pos + ( ou - edge->opos );
          goto Store_Point;
        }

        {
          FT_PtrDist  min, max, mid;
          FT_Pos      fpos;


          /* find enclosing edges */
          min = 0;
          max = edge_limit - edges;

#if 1
          /* for a small number of edges, a linear search is better */
          if ( max <= 8 )
          {
            FT_PtrDist  nn;


            for ( nn = 0; nn < max; nn++ )
              if ( edges[nn].fpos >= u )
                break;

            if ( edges[nn].fpos == u )
            {
              u = edges[nn].pos;
              goto Store_Point;
            }
            min = nn;
          }
          else
#endif
          while ( min < max )
          {
            mid  = ( max + min ) >> 1;
            edge = edges + mid;
            fpos = edge->fpos;

            if ( u < fpos )
              max = mid;
            else if ( u > fpos )
              min = mid + 1;
            else
            {
              /* we are on the edge */
              u = edge->pos;
              goto Store_Point;
            }
          }

          /* point is not on an edge */
          {
            AF_Edge  before = edges + min - 1;
            AF_Edge  after  = edges + min + 0;


            /* assert( before && after && before != after ) */
            if ( before->scale == 0 )
              before->scale = FT_DivFix( after->pos - before->pos,
                                         after->fpos - before->fpos );

            u = before->pos + FT_MulFix( fu - before->fpos,
                                         before->scale );
          }
        }

      Store_Point:
        /* save the point position */
        if ( dim == AF_DIMENSION_HORZ )
          point->x = u;
        else
          point->y = u;

        point->flags |= touch_flag;
      }
    }
  }